

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int fmt::internal::CharTraits<wchar_t>::format_float<long_double>
              (wchar_t *buffer,size_t size,wchar_t *format,uint width,int precision,longdouble value
              )

{
  uint in_ECX;
  wchar_t *in_RDX;
  size_t in_RSI;
  wchar_t *in_RDI;
  uint in_R8D;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_4;
  
  if (in_ECX == 0) {
    if ((int)in_R8D < 0) {
      local_3c = swprintf(in_RDI,in_RSI,in_RDX);
    }
    else {
      local_3c = swprintf(in_RDI,in_RSI,in_RDX,(ulong)in_R8D);
    }
    local_4 = local_3c;
  }
  else {
    if ((int)in_R8D < 0) {
      local_40 = swprintf(in_RDI,in_RSI,in_RDX,(ulong)in_ECX);
    }
    else {
      local_40 = swprintf(in_RDI,in_RSI,in_RDX,(ulong)in_ECX,(ulong)in_R8D);
    }
    local_4 = local_40;
  }
  return local_4;
}

Assistant:

int fmt::internal::CharTraits<wchar_t>::format_float(
    wchar_t *buffer, std::size_t size, const wchar_t *format,
    unsigned width, int precision, T value) {
  if (width == 0) {
    return precision < 0 ?
        FMT_SWPRINTF(buffer, size, format, value) :
        FMT_SWPRINTF(buffer, size, format, precision, value);
  }
  return precision < 0 ?
      FMT_SWPRINTF(buffer, size, format, width, value) :
      FMT_SWPRINTF(buffer, size, format, width, precision, value);
}